

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int Insert_String(FORM *form,int row,char *txt,int len)

{
  FIELD *field_00;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *Space;
  int result;
  char *split;
  int requiredlen;
  int freelen;
  int datalen;
  char *bp;
  FIELD *field;
  int len_local;
  char *txt_local;
  int row_local;
  FORM *form_local;
  
  field_00 = form->current;
  _freelen = field_00->buf + row * field_00->dcols;
  pcVar4 = After_End_Of_Data(_freelen,field_00->dcols);
  iVar2 = field_00->dcols - ((int)pcVar4 - (int)_freelen);
  iVar3 = len + 1;
  Space._4_4_ = -0xc;
  pcVar4 = (char *)malloc(2);
  strcpy(pcVar4," ");
  if (iVar2 < iVar3) {
    if ((row == field_00->drows + -1) && ((field_00->status & 8) != 0)) {
      _Var1 = Field_Grown(field_00,1);
      if (!_Var1) {
        free(pcVar4);
        return -1;
      }
      _freelen = field_00->buf + row * field_00->dcols;
    }
    if (row < field_00->drows + -1) {
      pcVar5 = Get_Start_Of_Data(_freelen + ((long)field_00->dcols - (long)iVar3),iVar3);
      pcVar5 = After_Last_Whitespace_Character(_freelen,(int)pcVar5 - (int)_freelen);
      iVar3 = (int)pcVar5 - (int)_freelen;
      Space._4_4_ = Insert_String(form,row + 1,pcVar5,field_00->dcols - (iVar3 + iVar2));
      if (Space._4_4_ == 0) {
        wmove(form->w,row,iVar3);
        wclrtoeol(form->w);
        wmove(form->w,row,0);
        winsnstr(form->w,txt,len);
        wmove(form->w,row,len);
        winsnstr(form->w,pcVar4,1);
        free(pcVar4);
        return 0;
      }
    }
    free(pcVar4);
    form_local._4_4_ = Space._4_4_;
  }
  else {
    wmove(form->w,row,0);
    winsnstr(form->w,txt,len);
    wmove(form->w,row,len);
    winsnstr(form->w,pcVar4,1);
    free(pcVar4);
    form_local._4_4_ = 0;
  }
  return form_local._4_4_;
}

Assistant:

static int Insert_String(FORM *form, int row, char *txt, int len)
{ 
  FIELD  *field    = form->current;
  char *bp         = Address_Of_Row_In_Buffer(field,row);
  int datalen      = (int)(After_End_Of_Data(bp,field->dcols) - bp);
  int freelen      = field->dcols - datalen;
  int requiredlen  = len+1;
  char *split;
  int result = E_REQUEST_DENIED;
  char *Space;

  Space = (char*)malloc(2*sizeof(char));
  strcpy(Space, " ");

  if (freelen >= requiredlen)
    {
      wmove(form->w,row,0);
      winsnstr(form->w,txt,len);
      wmove(form->w,row,len);
      winsnstr(form->w,Space,1);
      free(Space);
      return E_OK;
    }
  else
    { /* we have to move characters on the next line. If we are on the
         last line this may work, if the field is growable */
      if ((row == (field->drows - 1)) && Growable(field))
        {
          if (!Field_Grown(field,1))
            {
            free(Space);
            return(E_SYSTEM_ERROR);
            }
          /* !!!Side-Effect : might be changed due to growth!!! */
          bp = Address_Of_Row_In_Buffer(field,row); 
        }

      if (row < (field->drows - 1)) 
        { 
          split = After_Last_Whitespace_Character(bp,
                    (int)(Get_Start_Of_Data(bp + field->dcols - requiredlen ,
                                            requiredlen) - bp));
          /* split points now to the first character of the portion of the
             line that must be moved to the next line */
          datalen = (int)(split-bp); /* + freelen has to stay on this line   */
          freelen = field->dcols - (datalen + freelen); /* for the next line */

          if ((result=Insert_String(form,row+1,split,freelen))==E_OK) 
            {
              wmove(form->w,row,datalen);
              wclrtoeol(form->w);
              wmove(form->w,row,0);
              winsnstr(form->w,txt,len);
              wmove(form->w,row,len);
              winsnstr(form->w,Space,1);
              free(Space);
              return E_OK;
            }
        }
      free(Space);
      return(result);
    }
}